

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequence.cpp
# Opt level: O2

void __thiscall BamTools::SamSequence::SamSequence(SamSequence *this)

{
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  std::__cxx11::string::string((string *)this,"",&local_31);
  std::__cxx11::string::string((string *)&this->Checksum,"",&local_32);
  std::__cxx11::string::string((string *)&this->Length,"",&local_33);
  std::__cxx11::string::string((string *)&this->Name,"",&local_34);
  std::__cxx11::string::string((string *)&this->Species,"",&local_35);
  std::__cxx11::string::string((string *)&this->URI,"",&local_36);
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

SamSequence::SamSequence(void)
    : AssemblyID("")
    , Checksum("")
    , Length("")
    , Name("")
    , Species("")
    , URI("")
{ }